

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O1

void update_last(EverCrypt_Hash_state_s *s,uint64_t prev_len,uint8_t *last,uint32_t last_len)

{
  Lib_IntVector_Intrinsics_vec256 *palVar1;
  longlong lVar2;
  undefined1 totlen [16];
  undefined1 prev [16];
  undefined1 totlen_00 [16];
  undefined1 prev_00 [16];
  uint32_t rem;
  Spec_Hash_Definitions_hash_alg a;
  uint64_t *p1;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Lib_IntVector_Intrinsics_vec128 wv [4];
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  uint64_t local_c0 [23];
  
  if (0xd < s->tag) {
    update_last_cold_1();
    if (0xd < s->tag) {
      finish_cold_1();
      return;
    }
    palVar1 = (s->field_1).case_Blake2B_256_s;
    switch(s->tag) {
    case '\0':
      Hacl_Hash_MD5_finish((uint32_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x01':
      Hacl_Hash_SHA1_finish((uint32_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x02':
      Hacl_Hash_SHA2_sha224_finish((uint32_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x03':
      Hacl_Hash_SHA2_sha256_finish((uint32_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x04':
      Hacl_Hash_SHA2_sha384_finish((uint64_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x05':
      Hacl_Hash_SHA2_sha512_finish((uint64_t *)palVar1,(uint8_t *)prev_len);
      return;
    case '\x06':
      uVar3 = (undefined4)(*palVar1)[0];
      uVar4 = *(undefined4 *)((long)*palVar1 + 4);
      uVar5 = (undefined4)(*palVar1)[1];
      uVar6 = *(undefined4 *)((long)*palVar1 + 0xc);
      lVar2 = (*palVar1)[2];
      *(int *)(prev_len + 0x18) = (int)(*palVar1)[3];
      *(longlong *)(prev_len + 0x10) = lVar2;
      goto LAB_0017b5d0;
    case '\a':
      uVar3 = (undefined4)(*palVar1)[0];
      uVar4 = *(undefined4 *)((long)*palVar1 + 4);
      uVar5 = (undefined4)(*palVar1)[1];
      uVar6 = *(undefined4 *)((long)*palVar1 + 0xc);
      uVar7 = (undefined4)(*palVar1)[2];
      uVar8 = *(undefined4 *)((long)*palVar1 + 0x14);
      uVar9 = (undefined4)(*palVar1)[3];
      uVar10 = *(undefined4 *)((long)*palVar1 + 0x1c);
      goto LAB_0017b5cc;
    case '\b':
      uVar3 = (undefined4)(*palVar1)[0];
      uVar4 = *(undefined4 *)((long)*palVar1 + 4);
      uVar5 = (undefined4)(*palVar1)[1];
      uVar6 = *(undefined4 *)((long)*palVar1 + 0xc);
      uVar7 = (undefined4)(*palVar1)[2];
      uVar8 = *(undefined4 *)((long)*palVar1 + 0x14);
      uVar9 = (undefined4)(*palVar1)[3];
      uVar10 = *(undefined4 *)((long)*palVar1 + 0x1c);
      uVar11 = (undefined4)palVar1[1][0];
      uVar12 = *(undefined4 *)((long)palVar1[1] + 4);
      uVar13 = (undefined4)palVar1[1][1];
      uVar14 = *(undefined4 *)((long)palVar1[1] + 0xc);
      break;
    case '\t':
      uVar3 = (undefined4)(*palVar1)[0];
      uVar4 = *(undefined4 *)((long)*palVar1 + 4);
      uVar5 = (undefined4)(*palVar1)[1];
      uVar6 = *(undefined4 *)((long)*palVar1 + 0xc);
      uVar7 = (undefined4)(*palVar1)[2];
      uVar8 = *(undefined4 *)((long)*palVar1 + 0x14);
      uVar9 = (undefined4)(*palVar1)[3];
      uVar10 = *(undefined4 *)((long)*palVar1 + 0x1c);
      uVar11 = (undefined4)palVar1[1][0];
      uVar12 = *(undefined4 *)((long)palVar1[1] + 4);
      uVar13 = (undefined4)palVar1[1][1];
      uVar14 = *(undefined4 *)((long)palVar1[1] + 0xc);
      lVar2 = palVar1[1][3];
      *(longlong *)(prev_len + 0x30) = palVar1[1][2];
      *(longlong *)(prev_len + 0x38) = lVar2;
      break;
    case '\n':
      Hacl_Hash_Blake2s_finish(0x20,(uint8_t *)prev_len,(uint32_t *)palVar1);
      return;
    case '\v':
      Hacl_Hash_Blake2s_Simd128_finish
                (0x20,(uint8_t *)prev_len,(Lib_IntVector_Intrinsics_vec128 *)palVar1);
      return;
    case '\f':
      Hacl_Hash_Blake2b_finish(0x40,(uint8_t *)prev_len,(uint64_t *)palVar1);
      return;
    case '\r':
      Hacl_Hash_Blake2b_Simd256_finish(0x40,(uint8_t *)prev_len,palVar1);
      return;
    }
    *(undefined4 *)(prev_len + 0x20) = uVar11;
    *(undefined4 *)(prev_len + 0x24) = uVar12;
    *(undefined4 *)(prev_len + 0x28) = uVar13;
    *(undefined4 *)(prev_len + 0x2c) = uVar14;
LAB_0017b5cc:
    *(undefined4 *)(prev_len + 0x10) = uVar7;
    *(undefined4 *)(prev_len + 0x14) = uVar8;
    *(undefined4 *)(prev_len + 0x18) = uVar9;
    *(undefined4 *)(prev_len + 0x1c) = uVar10;
LAB_0017b5d0:
    *(undefined4 *)prev_len = uVar3;
    *(undefined4 *)(prev_len + 4) = uVar4;
    *(undefined4 *)(prev_len + 8) = uVar5;
    *(undefined4 *)(prev_len + 0xc) = uVar6;
    return;
  }
  palVar1 = (Lib_IntVector_Intrinsics_vec256 *)(s->field_1).case_MD5_s;
  rem = (uint32_t)prev_len;
  switch(s->tag) {
  case '\0':
    Hacl_Hash_MD5_update_last((uint32_t *)palVar1,prev_len,last,last_len);
    break;
  case '\x01':
    Hacl_Hash_SHA1_update_last((uint32_t *)palVar1,prev_len,last,last_len);
    break;
  case '\x02':
    Hacl_Hash_SHA2_sha224_update_last(last_len + prev_len,last_len,last,(uint32_t *)palVar1);
    break;
  case '\x03':
    Hacl_Hash_SHA2_sha256_update_last(last_len + prev_len,last_len,last,(uint32_t *)palVar1);
    break;
  case '\x04':
    totlen._8_8_ = in_stack_ffffffffffffff28;
    totlen._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha384_update_last
              ((FStar_UInt128_uint128)totlen,last_len + rem,
               (uint8_t *)(ulong)CARRY8((ulong)last_len,prev_len),(uint64_t *)(ulong)last_len);
    break;
  case '\x05':
    totlen_00._8_8_ = in_stack_ffffffffffffff28;
    totlen_00._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)totlen_00,last_len + rem,
               (uint8_t *)(ulong)CARRY8((ulong)last_len,prev_len),(uint64_t *)(ulong)last_len);
    break;
  case '\x06':
    a = '\t';
    goto LAB_0017b4fb;
  case '\a':
    a = '\b';
    goto LAB_0017b4fb;
  case '\b':
    a = '\n';
    goto LAB_0017b4fb;
  case '\t':
    a = '\v';
LAB_0017b4fb:
    Hacl_Hash_SHA3_update_last_sha3(a,(uint64_t *)palVar1,last,last_len);
    break;
  case '\n':
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_update_last
              (last_len,(uint32_t *)local_c0,(uint32_t *)palVar1,prev_len,last_len,last);
    break;
  case '\v':
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_Simd128_update_last
              (last_len,(Lib_IntVector_Intrinsics_vec128 *)local_c0,
               (Lib_IntVector_Intrinsics_vec128 *)palVar1,prev_len,last_len,last);
    break;
  case '\f':
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev._8_8_ = in_stack_ffffffffffffff28;
    prev._0_8_ = last;
    Hacl_Hash_Blake2b_update_last
              (last_len,local_c0,(uint64_t *)palVar1,(FStar_UInt128_uint128)prev,rem,(uint8_t *)0x0)
    ;
    break;
  case '\r':
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev_00._8_8_ = in_stack_ffffffffffffff28;
    prev_00._0_8_ = last;
    Hacl_Hash_Blake2b_Simd256_update_last
              (last_len,(Lib_IntVector_Intrinsics_vec256 *)local_c0,palVar1,
               (FStar_UInt128_uint128)prev_00,rem,(uint8_t *)0x0);
  }
  return;
}

Assistant:

static void
update_last(EverCrypt_Hash_state_s *s, uint64_t prev_len, uint8_t *last, uint32_t last_len)
{
  EverCrypt_Hash_state_s scrut = *s;
  if (scrut.tag == MD5_s)
  {
    uint32_t *p1 = scrut.case_MD5_s;
    Hacl_Hash_MD5_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA1_s)
  {
    uint32_t *p1 = scrut.case_SHA1_s;
    Hacl_Hash_SHA1_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA2_224_s)
  {
    uint32_t *p1 = scrut.case_SHA2_224_s;
    Hacl_Hash_SHA2_sha224_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_256_s)
  {
    uint32_t *p1 = scrut.case_SHA2_256_s;
    Hacl_Hash_SHA2_sha256_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_384_s)
  {
    uint64_t *p1 = scrut.case_SHA2_384_s;
    Hacl_Hash_SHA2_sha384_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA2_512_s)
  {
    uint64_t *p1 = scrut.case_SHA2_512_s;
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA3_224_s)
  {
    uint64_t *p1 = scrut.case_SHA3_224_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_224, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_256_s)
  {
    uint64_t *p1 = scrut.case_SHA3_256_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_256, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_384_s)
  {
    uint64_t *p1 = scrut.case_SHA3_384_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_384, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_512_s)
  {
    uint64_t *p1 = scrut.case_SHA3_512_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_512, p1, last, last_len);
    return;
  }
  if (scrut.tag == Blake2S_s)
  {
    uint32_t *p1 = scrut.case_Blake2S_s;
    uint32_t wv[16U] = { 0U };
    Hacl_Hash_Blake2s_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
  }
  if (scrut.tag == Blake2S_128_s)
  {
    Lib_IntVector_Intrinsics_vec128 *p1 = scrut.case_Blake2S_128_s;
    #if HACL_CAN_COMPILE_VEC128
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 wv[4U] KRML_POST_ALIGN(16) = { 0U };
    Hacl_Hash_Blake2s_Simd128_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  if (scrut.tag == Blake2B_s)
  {
    uint64_t *p1 = scrut.case_Blake2B_s;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
  }
  if (scrut.tag == Blake2B_256_s)
  {
    Lib_IntVector_Intrinsics_vec256 *p1 = scrut.case_Blake2B_256_s;
    #if HACL_CAN_COMPILE_VEC256
    KRML_PRE_ALIGN(32) Lib_IntVector_Intrinsics_vec256 wv[4U] KRML_POST_ALIGN(32) = { 0U };
    Hacl_Hash_Blake2b_Simd256_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}